

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

unsigned_long _computeNumberOperation<unsigned_long,unsigned_char>(TokenType type,uchar x,uchar y)

{
  allocator<char> local_39;
  string local_38;
  uchar local_14;
  uchar local_13;
  TokenType local_12;
  uchar y_local;
  uchar x_local;
  unsigned_long uStack_10;
  TokenType type_local;
  
  switch(type) {
  case TOK_OP_ADD:
    uStack_10 = (unsigned_long)(int)((uint)x + (uint)y);
    break;
  case TOK_OP_SUB:
    uStack_10 = (unsigned_long)(int)((uint)x - (uint)y);
    break;
  default:
    local_14 = y;
    local_13 = x;
    local_12 = type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unknown operation",&local_39);
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0x8b,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    uStack_10 = 0;
    break;
  case TOK_OP_MUL:
    uStack_10 = (unsigned_long)(int)((uint)x * (uint)y);
    break;
  case TOK_OP_DIV:
    uStack_10 = (unsigned_long)(int)((ulong)x / (ulong)(long)(int)(uint)y);
  }
  return uStack_10;
}

Assistant:

static R _computeNumberOperation(TokenType type, T x, T y) noexcept {
	switch (type) {
	case TokenType::TOK_OP_ADD:
		return static_cast<R>(x + y);
  case TokenType::TOK_OP_SUB:
		return static_cast<R>(x - y);
  case TokenType::TOK_OP_MUL:
		return static_cast<R>(x * y);
  case TokenType::TOK_OP_DIV:
		return static_cast<R>(x / y);
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}